

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_warningUnrequiredCircularDependencyComponent_Test::
Importer_warningUnrequiredCircularDependencyComponent_Test
          (Importer_warningUnrequiredCircularDependencyComponent_Test *this)

{
  Importer_warningUnrequiredCircularDependencyComponent_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Importer_warningUnrequiredCircularDependencyComponent_Test_001a0ee0;
  return;
}

Assistant:

TEST(Importer, warningUnrequiredCircularDependencyComponent)
{
    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/master1.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    // Expect no issues, as the circular component dependency is not instantiated.
    EXPECT_EQ(size_t(0), importer->issueCount());
}